

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O2

void demmt_nouveau_decode_gem_pushbuf_data
               (int nr_buffers,drm_nouveau_gem_pushbuf_bo *buffers,int nr_push,
               drm_nouveau_gem_pushbuf_push *push,int nr_relocs,
               drm_nouveau_gem_pushbuf_reloc *relocs)

{
  char *pcVar1;
  char *pcVar2;
  uint64_t address;
  uint uVar3;
  gpu_object *dev;
  gpu_mapping *gpu_mapping;
  ulong uVar5;
  __u64 *p_Var6;
  ulong uVar7;
  long lVar8;
  __u32 *p_Var9;
  pushbuf_decode_state local_68;
  ulong uVar4;
  
  if (dump_decoded_ioctl_data == 0) {
    uVar5 = 0;
    if (0 < nr_push) {
      uVar5 = (ulong)(uint)nr_push;
    }
  }
  else {
    uVar5 = (ulong)(uint)nr_buffers;
    if (nr_buffers < 1) {
      uVar5 = 0;
    }
    p_Var6 = &(buffers->presumed).offset;
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: buffer[%d]: handle: %s%2d%s",uVar7 & 0xffffffff,colors->num,
                (ulong)*(uint *)(p_Var6 + -3),colors->reset);
      }
      else {
        fprintf(_stdout,"%64sbuffer[%d]: handle: %s%2d%s"," ",uVar7 & 0xffffffff,colors->num,
                (ulong)*(uint *)(p_Var6 + -3),colors->reset);
      }
      fprintf(_stdout,", read_domains: %s","");
      decode_domain(*(uint32_t *)((long)p_Var6 + -0x14),4);
      fprintf(_stdout,", write_domains: %s","");
      decode_domain(*(uint32_t *)(p_Var6 + -2),4);
      fprintf(_stdout,", valid_domains: %s","");
      decode_domain(*(uint32_t *)((long)p_Var6 + -0xc),4);
      fprintf(_stdout,", presumed.valid: %d",
              (ulong)((drm_nouveau_gem_pushbuf_bo_presumed *)(p_Var6 + -1))->valid);
      fprintf(_stdout,", presumed.domain: %s","");
      decode_domain(*(__u32 *)((long)p_Var6 + -4),4);
      fprintf(_stdout,", presumed.gpu_start: %s0x%lx%s",colors->eval,*p_Var6,colors->reset);
      fputc(10,_stdout);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      p_Var6 = p_Var6 + 5;
    }
    uVar5 = (ulong)(uint)nr_relocs;
    if (nr_relocs < 1) {
      uVar5 = 0;
    }
    p_Var9 = &relocs->tor;
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      if (indent_logs == 0) {
        fprintf(_stdout,
                "LOG: relocs[%d]: reloc_bo_index: %d, reloc_bo_offset: %d, bo_index: %d, flags: 0x%x, data: 0x%x, vor: 0x%x, tor: 0x%x\n"
                ,uVar7 & 0xffffffff,
                (ulong)((drm_nouveau_gem_pushbuf_reloc *)(p_Var9 + -6))->reloc_bo_index,
                (ulong)p_Var9[-5],(ulong)p_Var9[-4],(ulong)p_Var9[-3],(ulong)p_Var9[-2],
                (ulong)p_Var9[-1],(ulong)*p_Var9);
      }
      else {
        fprintf(_stdout,
                "%64srelocs[%d]: reloc_bo_index: %d, reloc_bo_offset: %d, bo_index: %d, flags: 0x%x, data: 0x%x, vor: 0x%x, tor: 0x%x\n"
                ," ",uVar7 & 0xffffffff,
                (ulong)((drm_nouveau_gem_pushbuf_reloc *)(p_Var9 + -6))->reloc_bo_index,
                (ulong)p_Var9[-5],(ulong)p_Var9[-4],(ulong)p_Var9[-3],(ulong)p_Var9[-2],
                (ulong)p_Var9[-1],(ulong)*p_Var9);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      p_Var9 = p_Var9 + 7;
    }
    uVar5 = (ulong)(uint)nr_push;
    if (nr_push < 1) {
      uVar5 = 0;
    }
    p_Var6 = &push->length;
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      uVar4 = (ulong)((uint)*p_Var6 & 0x7ffffc);
      pcVar1 = colors->reset;
      pcVar2 = colors->num;
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG: push[%d]: bo_index: %d, offset: %s0x%lx%s, length: %s0x%lx%s",
                uVar7 & 0xffffffff,(ulong)((drm_nouveau_gem_pushbuf_push *)(p_Var6 + -2))->bo_index,
                pcVar2,p_Var6[-1],pcVar1,pcVar2,uVar4,pcVar1);
      }
      else {
        fprintf(_stdout,"%64spush[%d]: bo_index: %d, offset: %s0x%lx%s, length: %s0x%lx%s"," ",
                uVar7 & 0xffffffff,(ulong)((drm_nouveau_gem_pushbuf_push *)(p_Var6 + -2))->bo_index,
                pcVar2,p_Var6[-1],pcVar1,pcVar2,uVar4,pcVar1);
      }
      uVar4 = *p_Var6;
      if ((uVar4 & 1) != 0) {
        fprintf(_stdout,", unk8: 1%s","");
        uVar4 = *p_Var6;
      }
      uVar3 = (uint)uVar4;
      if ((uVar4 & 2) != 0) {
        fprintf(_stdout,", not_main: 1%s","");
        uVar3 = (uint)*p_Var6;
      }
      if ((uVar3 >> 0x17 & 1) != 0) {
        fprintf(_stdout,", no_prefetch: 1%s","");
      }
      fputc(10,_stdout);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      p_Var6 = p_Var6 + 3;
    }
  }
  local_68.skip = 0;
  local_68.next_command_offset = 0;
  local_68.long_command = 0;
  local_68.mthd = 0;
  local_68.incr = 0;
  local_68.subchan = 0;
  local_68.addr = 0;
  local_68.size = 0;
  local_68.mthd_data_available = 0;
  local_68.mthd_data = 0;
  local_68.fifo = gpu_object_find(0,0xf1f0eeee);
  dev = nvrm_get_device(local_68.fifo);
  for (lVar8 = 0; uVar5 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
    address = buffers[*(uint *)((long)&push->bo_index + lVar8)].presumed.offset;
    gpu_mapping = gpu_mapping_find(address,dev);
    if (gpu_mapping == (gpu_mapping *)0x0) {
      fprintf(_stdout,"ERROR: couldn\'t find buffer 0x%lx\n",address);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    else {
      pushbuf_print(&local_68,gpu_mapping,address + *(long *)((long)&push->offset + lVar8),
                    *(uint *)((long)&push->length + lVar8) >> 2 & 0x1fffff);
    }
  }
  return;
}

Assistant:

static void demmt_nouveau_decode_gem_pushbuf_data(
		int nr_buffers, struct drm_nouveau_gem_pushbuf_bo *buffers,
		int nr_push,    struct drm_nouveau_gem_pushbuf_push *push,
		int nr_relocs,  struct drm_nouveau_gem_pushbuf_reloc *relocs)
{
	int i;

	if (dump_decoded_ioctl_data)
	{
		for (i = 0; i < nr_buffers; ++i)
		{
			mmt_log("buffer[%d]: handle: %s%2d%s",
					i, colors->num, buffers[i].handle, colors->reset);
			mmt_log_cont(", read_domains: %s", "");
			decode_domain(buffers[i].read_domains, 4);
			mmt_log_cont(", write_domains: %s", "");
			decode_domain(buffers[i].write_domains, 4);
			mmt_log_cont(", valid_domains: %s", "");
			decode_domain(buffers[i].valid_domains, 4);
			mmt_log_cont(", presumed.valid: %d", buffers[i].presumed.valid);
			mmt_log_cont(", presumed.domain: %s", "");
			decode_domain(buffers[i].presumed.domain, 4);
			mmt_log_cont(", presumed.gpu_start: %s0x%" PRIx64 "%s",
					colors->eval, buffers[i].presumed.offset, colors->reset);
			mmt_log_cont_nl();
		}
		for (i = 0; i < nr_relocs; ++i)
			mmt_log("relocs[%d]: reloc_bo_index: %d, reloc_bo_offset: %d, bo_index: %d, flags: 0x%x, data: 0x%x, vor: 0x%x, tor: 0x%x\n",
					i, relocs[i].reloc_bo_index, relocs[i].reloc_bo_offset,
					relocs[i].bo_index, relocs[i].flags, relocs[i].data,
					relocs[i].vor, relocs[i].tor);
		for (i = 0; i < nr_push; ++i)
		{
			mmt_log("push[%d]: bo_index: %d, offset: %s0x%" PRIx64 "%s, length: %s0x%" PRIx64 "%s",
					i, push[i].bo_index, colors->num, push[i].offset, colors->reset,
					colors->num, push[i].length & 0x007ffffc, colors->reset);
			if (push[i].length & 1)
				mmt_log_cont(", unk8: 1%s", "");
			if (push[i].length & 2)
				mmt_log_cont(", not_main: 1%s", "");
			if (push[i].length & 0x00800000)
				mmt_log_cont(", no_prefetch: 1%s", "");
			mmt_log_cont_nl();
		}
	}

	struct pushbuf_decode_state pstate = { 0 };
	pstate.fifo = gpu_object_find(0, 0xf1f0eeee); // hack
	struct gpu_object *dev = nvrm_get_device(pstate.fifo);

	for (i = 0; i < nr_push; ++i)
	{
		uint64_t gpu_start = buffers[push[i].bo_index].presumed.offset;

		struct gpu_mapping *gmapping = gpu_mapping_find(gpu_start, dev);
		if (gmapping)
			pushbuf_print(&pstate, gmapping, gpu_start + push[i].offset, (push[i].length & 0x007ffffc) >> 2);
		else
			mmt_error("couldn't find buffer 0x%" PRIx64 "\n", gpu_start);
	}
}